

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

void nh_ws_parse(ws_context_t *ctx)

{
  uint32_t *puVar1;
  uchar uVar2;
  nh_ws_parse_state nVar3;
  byte *pbVar4;
  uint64_t uVar5;
  uint32_t uVar6;
  uchar *puVar7;
  char *pcVar8;
  uint uVar9;
  long lVar10;
  uint64_t uVar11;
  nh_stream_t *stream;
  char *__dest;
  size_t __n;
  uint uVar12;
  
  if ((ctx->stream).length < 6) {
    return;
  }
  nVar3 = ctx->parse_state;
  if (nVar3 == PARSE_WS_DONE) goto LAB_00106f2f;
  if (nVar3 != PARSE_WS_PAYLOAD) {
    if (nVar3 != PARSE_WS_HEAD) {
      return;
    }
    pbVar4 = (byte *)(ctx->stream).buf;
    (ctx->frame).fin = *pbVar4 >> 7;
    (ctx->frame).opcode = *pbVar4 & 0xf;
    (ctx->stream).index = 1;
    (ctx->frame).mask = pbVar4[1] >> 7;
    uVar9 = pbVar4[1] & 0x7f;
    (ctx->frame).payload_length = (ulong)uVar9;
    (ctx->stream).index = 2;
    if ((ulong)uVar9 == 0x7f) {
      (ctx->frame).payload_length = *(uint64_t *)(pbVar4 + 2);
      puVar7 = (uchar *)((long)&(ctx->frame).payload_length + 7);
      lVar10 = 0;
      do {
        uVar2 = (ctx->frame).masking_key[lVar10 + -8];
        (ctx->frame).masking_key[lVar10 + -8] = *puVar7;
        *puVar7 = uVar2;
        lVar10 = lVar10 + 1;
        puVar7 = puVar7 + -1;
      } while (lVar10 != 4);
      uVar6 = (ctx->stream).index + 8;
LAB_00106ea2:
      (ctx->stream).index = uVar6;
    }
    else if (uVar9 == 0x7e) {
      (ctx->frame).payload_length =
           (ulong)(ushort)(*(ushort *)(pbVar4 + 2) << 8 | *(ushort *)(pbVar4 + 2) >> 8);
      uVar6 = 4;
      goto LAB_00106ea2;
    }
    uVar9 = (ctx->stream).index;
    *(undefined4 *)(ctx->frame).masking_key = *(undefined4 *)((ctx->stream).buf + uVar9);
    (ctx->stream).index = uVar9 + 4;
    uVar5 = (ctx->frame).payload_length;
    if (uVar5 == 0) {
      ctx->parse_state = PARSE_WS_DONE;
      return;
    }
    pcVar8 = (char *)malloc(uVar5 + 1);
    (ctx->frame).payload = pcVar8;
    pcVar8[uVar5] = '\0';
    ctx->parse_state = PARSE_WS_PAYLOAD;
  }
  uVar5 = (ctx->frame).payload_consumed_length;
  __n = (ctx->frame).payload_length - uVar5;
  uVar9 = (ctx->stream).index;
  __dest = (ctx->frame).payload + uVar5;
  uVar12 = (ctx->stream).length - uVar9;
  pcVar8 = (ctx->stream).buf + uVar9;
  if (uVar12 < __n) {
    memcpy(__dest,pcVar8,(ulong)uVar12);
    (ctx->frame).payload_consumed_length = (ctx->frame).payload_length;
    puVar1 = &(ctx->stream).index;
    *puVar1 = *puVar1 + uVar12;
    return;
  }
  memcpy(__dest,pcVar8,__n);
  (ctx->frame).payload_consumed_length = (ctx->frame).payload_length;
  puVar1 = &(ctx->stream).index;
  *puVar1 = *puVar1 + (int)__n;
  ctx->parse_state = PARSE_WS_DONE;
LAB_00106f2f:
  uVar5 = (ctx->frame).payload_length;
  if (uVar5 != 0) {
    pcVar8 = (ctx->frame).payload;
    uVar11 = 0;
    do {
      pbVar4 = (byte *)(pcVar8 + uVar11);
      *pbVar4 = *pbVar4 ^ (ctx->frame).masking_key[(uint)uVar11 & 3];
      uVar11 = uVar11 + 1;
    } while (uVar5 != uVar11);
  }
  pcVar8 = (ctx->stream).buf;
  if (pcVar8 != (char *)0x0) {
    free(pcVar8);
    (ctx->stream).buf = (char *)0x0;
    (ctx->stream).length = 0;
    (ctx->stream).index = 0;
  }
  return;
}

Assistant:

void nh_ws_parse(ws_context_t *ctx) {
    /**
      0                   1                   2                   3
      0 1 2 3 4 5 6 7 8 9 0 1 2 3 4 5 6 7 8 9 0 1 2 3 4 5 6 7 8 9 0 1
     +-+-+-+-+-------+-+-------------+-------------------------------+
     |F|R|R|R| opcode|M| Payload     |    Extended payload length    |
     |I|S|S|S|  (4)  |A|     (7)     |             (16/64)           |
     |N|V|V|V|       |S|             |   (if payload len==126/127)   |
     | |1|2|3|       |K|             |                               |
     +-+-+-+-+-------+-+-------------+ - - - - - - - - - - - - - - - +
     |     Extended payload length continued, if payload len == 127  |
     + - - - - - - - - - - - - - - - +-------------------------------+
     |                               |Masking-key, if MASK set to 1  |
     +-------------------------------+-------------------------------+
     | Masking-key (continued)       |          Payload Data         |
     +-------------------------------- - - - - - - - - - - - - - - - +
     :                     Payload Data continued ...                :
     + - - - - - - - - - - - - - - - - - - - - - - - - - - - - - - - +
     |                     Payload Data continued ...                |
     +---------------------------------------------------------------+
     **/

    nh_stream_t *stream = &ctx->stream;
    // return if not complete
    if (stream->length < 6) return;

    nh_ws_frame *frame = &ctx->frame;
    uint64_t need_len, remain_len;
    switch (ctx->parse_state) {
        case PARSE_WS_HEAD:
            frame->fin = (stream->buf[0] & 0x80) == 0x80;
            // skip parse RSV1~3
            frame->opcode = stream->buf[0] & 0x0F;
            stream->index = 1;
            frame->mask = (stream->buf[1] & 0x80) == 0X80;
            frame->payload_length = stream->buf[1] & 0x7F;
            stream->index = 2;
            if (frame->payload_length == 126) {
                frame->payload_length = (stream->buf[stream->index] & 0xFF) << 8 |
                                        (stream->buf[stream->index + 1] & 0xFF);
                stream->index += 2;
            } else if (frame->payload_length == 127) {
                memcpy(&(frame->payload_length), &stream->buf[stream->index], 8);
                nh_reverse_endian((char *) &frame->payload_length, 8);
                stream->index += 8;
            }
            memcpy(&(frame->masking_key), &stream->buf[stream->index], 4);
            stream->index += 4;

            if (!frame->payload_length) {
                ctx->parse_state = PARSE_WS_DONE;
                return;
            }
            // prepare payload
            frame->payload = malloc(sizeof(char) * frame->payload_length + 1);
            frame->payload[frame->payload_length] = '\0';
            ctx->parse_state = PARSE_WS_PAYLOAD;
            // fallthrough
        case PARSE_WS_PAYLOAD:
            need_len = frame->payload_length - frame->payload_consumed_length;
            remain_len = stream->length - stream->index;
            if (remain_len < need_len) {
                memcpy(&frame->payload[frame->payload_consumed_length],
                       &stream->buf[stream->index],
                       remain_len);
                frame->payload_consumed_length = frame->payload_length;
                stream->index += remain_len;
                return;
            }
            memcpy(&frame->payload[frame->payload_consumed_length],
                   &stream->buf[stream->index],
                   need_len);
            frame->payload_consumed_length = frame->payload_length;
            stream->index += need_len;
            ctx->parse_state = PARSE_WS_DONE;
            // fallthrough
        case PARSE_WS_DONE:
            nh_umask((unsigned char *) frame->payload, frame->payload_length, frame->masking_key);
            nh_stream_free(&ctx->stream);
            break;
    }
}